

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O0

void __thiscall insyde_fdm_t::fdm_extensions_t::_read(fdm_extensions_t *this)

{
  bool bVar1;
  vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
  *this_00;
  pointer this_01;
  fdm_extension_t *this_02;
  unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>
  local_28;
  int local_1c;
  int i;
  fdm_extensions_t *local_10;
  fdm_extensions_t *this_local;
  
  local_10 = this;
  this_00 = (vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
             *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::
  vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
  ::vector(this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>,std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>,std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>>>
              *)&stack0xffffffffffffffe8,this_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
  ::operator=(&this->m_extensions,
              (unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
               *)&stack0xffffffffffffffe8);
  std::
  unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                 *)&stack0xffffffffffffffe8);
  local_1c = 0;
  while( true ) {
    bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    this_01 = std::
              unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
              ::operator->(&this->m_extensions);
    this_02 = (fdm_extension_t *)operator_new(0x28);
    fdm_extension_t::fdm_extension_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
    std::
    unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>::
    unique_ptr<std::default_delete<insyde_fdm_t::fdm_extension_t>,void>
              ((unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>
                *)&local_28,this_02);
    std::
    vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
    ::push_back(this_01,(value_type *)&local_28);
    std::
    unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>::
    ~unique_ptr(&local_28);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void insyde_fdm_t::fdm_extensions_t::_read() {
    m_extensions = std::unique_ptr<std::vector<std::unique_ptr<fdm_extension_t>>>(new std::vector<std::unique_ptr<fdm_extension_t>>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_extensions->push_back(std::move(std::unique_ptr<fdm_extension_t>(new fdm_extension_t(m__io, this, m__root))));
            i++;
        }
    }
}